

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Acec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  Gia_Man_t *p;
  char *pcVar3;
  Gia_Man_t *pDual;
  Gia_Man_t *pGia1;
  Gia_Man_t *pGia0;
  uint local_90;
  int fTwoOutput;
  int fDualOutput;
  int fMiter;
  int nArgcNew;
  int c;
  char **pArgvNew;
  char *pTemp;
  char *FileName;
  Gia_Man_t *pSecond;
  Cec_ParCec_t *pPars;
  Cec_ParCec_t ParsCec;
  FILE *pFile;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pSecond = (Gia_Man_t *)((long)&pPars + 4);
  fTwoOutput = 0;
  local_90 = 0;
  pGia0._4_4_ = 0;
  Cec_ManCecSetDefaultParams((Cec_ParCec_t *)pSecond);
  Extra_UtilGetoptReset();
LAB_0027828c:
  do {
    fMiter = Extra_UtilGetopt(argc,argv,"CTnmdtvh");
    if (fMiter == -1) {
      if (fTwoOutput != 0) {
        if (pAbc->pGia == (Gia_Man_t *)0x0) {
          Abc_Print(-1,"Abc_CommandAbc9Acec(): There is no AIG.\n");
          return 1;
        }
        if (local_90 == 0) {
          if (pGia0._4_4_ == 0) {
            if (pSecond->nRegsAlloc == 0) {
              Abc_Print(1,
                        "Assuming the current network is a single-output miter. (Conflict limit = %d.)\n"
                        ,(ulong)*(uint *)&pSecond->pName);
            }
            p = Gia_ManDemiterToDual(pAbc->pGia);
            Gia_ManDemiterDual(p,&pGia1,&pDual);
            Gia_ManStop(p);
            iVar2 = Gia_PolynCec(pGia1,pDual,(Cec_ParCec_t *)pSecond);
            pAbc->Status = iVar2;
          }
          else {
            uVar1 = Gia_ManPoNum(pAbc->pGia);
            if ((uVar1 & 1) != 0) {
              Abc_Print(-1,"The dual-output miter should have an even number of outputs.\n");
              return 1;
            }
            if (pSecond->nRegsAlloc == 0) {
              Abc_Print(1,
                        "Assuming the current network is a two-word miter. (Conflict limit = %d.)\n"
                        ,(ulong)*(uint *)&pSecond->pName);
            }
            Gia_ManDemiterTwoWords(pAbc->pGia,&pGia1,&pDual);
            iVar2 = Gia_PolynCec(pGia1,pDual,(Cec_ParCec_t *)pSecond);
            pAbc->Status = iVar2;
          }
        }
        else {
          uVar1 = Gia_ManPoNum(pAbc->pGia);
          if ((uVar1 & 1) != 0) {
            Abc_Print(-1,"The dual-output miter should have an even number of outputs.\n");
            return 1;
          }
          if (pSecond->nRegsAlloc == 0) {
            Abc_Print(1,
                      "Assuming the current network is a double-output miter. (Conflict limit = %d.)\n"
                      ,(ulong)*(uint *)&pSecond->pName);
          }
          Gia_ManDemiterDual(pAbc->pGia,&pGia1,&pDual);
          iVar2 = Gia_PolynCec(pGia1,pDual,(Cec_ParCec_t *)pSecond);
          pAbc->Status = iVar2;
        }
        Abc_FrameReplaceCex(pAbc,&pGia1->pCexComb);
        Gia_ManStop(pGia1);
        Gia_ManStop(pDual);
        return 0;
      }
      _nArgcNew = argv + globalUtilOptind;
      fDualOutput = argc - globalUtilOptind;
      if (fDualOutput == 1) {
        pTemp = *_nArgcNew;
      }
      else {
        if (pAbc->pGia->pSpec == (char *)0x0) {
          Abc_Print(-1,"File name is not given on the command line.\n");
          return 1;
        }
        pTemp = pAbc->pGia->pSpec;
      }
      for (pArgvNew = (char **)pTemp; *(char *)pArgvNew != '\0';
          pArgvNew = (char **)((long)pArgvNew + 1)) {
        if (*(char *)pArgvNew == '>') {
          *(undefined1 *)pArgvNew = 0x5c;
        }
      }
      ParsCec._28_8_ = fopen(pTemp,"r");
      if ((FILE *)ParsCec._28_8_ == (FILE *)0x0) {
        Abc_Print(-1,"Cannot open input file \"%s\". ",pTemp);
        pTemp = Extra_FileGetSimilarName
                          (pTemp,".aig",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
        if (pTemp != (char *)0x0) {
          Abc_Print(1,"Did you mean \"%s\"?",pTemp);
        }
        Abc_Print(1,"\n");
        return 1;
      }
      fclose((FILE *)ParsCec._28_8_);
      FileName = (char *)Gia_AigerRead(pTemp,0,0,0);
      if ((Gia_Man_t *)FileName == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Reading AIGER has failed.\n");
        return 0;
      }
      iVar2 = Gia_PolynCec(pAbc->pGia,(Gia_Man_t *)FileName,(Cec_ParCec_t *)pSecond);
      pAbc->Status = iVar2;
      Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexComb);
      Gia_ManStop((Gia_Man_t *)FileName);
      return 0;
    }
    switch(fMiter) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_0027883f;
      }
      iVar2 = atoi(argv[globalUtilOptind]);
      *(int *)&pSecond->pName = iVar2;
      iVar2 = *(int *)&pSecond->pName;
      break;
    default:
      goto LAB_0027883f;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_0027883f;
      }
      iVar2 = atoi(argv[globalUtilOptind]);
      *(int *)((long)&pSecond->pName + 4) = iVar2;
      iVar2 = *(int *)((long)&pSecond->pName + 4);
      break;
    case 100:
      local_90 = local_90 ^ 1;
      goto LAB_0027828c;
    case 0x68:
      goto LAB_0027883f;
    case 0x6d:
      fTwoOutput = fTwoOutput ^ 1;
      goto LAB_0027828c;
    case 0x6e:
      pSecond->nRegs = pSecond->nRegs ^ 1;
      goto LAB_0027828c;
    case 0x74:
      pGia0._4_4_ = pGia0._4_4_ ^ 1;
      goto LAB_0027828c;
    case 0x76:
      pSecond->nObjsAlloc = pSecond->nObjsAlloc ^ 1;
      goto LAB_0027828c;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar2 < 0) {
LAB_0027883f:
      Abc_Print(-2,"usage: &acec [-CT num] [-nmdtvh]\n");
      Abc_Print(-2,"\t         combinational equivalence checking for arithmetic circuits\n");
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)*(uint *)&pSecond->pName);
      Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",
                (ulong)*(uint *)((long)&pSecond->pName + 4));
      pcVar3 = "no";
      if (pSecond->nRegs != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-n     : toggle using naive SAT-based checking [default = %s]\n",pcVar3);
      pcVar3 = "two circuits";
      if (fTwoOutput != 0) {
        pcVar3 = "miter";
      }
      Abc_Print(-2,"\t-m     : toggle miter vs. two circuits [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (local_90 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-d     : toggle using dual output miter [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (pGia0._4_4_ != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-t     : toggle using two-word miter [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (pSecond->nObjsAlloc != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Acec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pFile;
    Cec_ParCec_t ParsCec, * pPars = &ParsCec;
    Gia_Man_t * pSecond;
    char * FileName, * pTemp;
    char ** pArgvNew;
    int c, nArgcNew, fMiter = 0, fDualOutput = 0, fTwoOutput = 0;
    Cec_ManCecSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CTnmdtvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 'n':
            pPars->fNaive ^= 1;
            break;
        case 'm':
            fMiter ^= 1;
            break;
        case 'd':
            fDualOutput ^= 1;
            break;
        case 't':
            fTwoOutput ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( fMiter )
    {
        Gia_Man_t * pGia0, * pGia1, * pDual;
        if ( pAbc->pGia == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9Acec(): There is no AIG.\n" );
            return 1;
        }
        if ( fDualOutput )
        {
            if ( Gia_ManPoNum(pAbc->pGia) & 1 )
            {
                Abc_Print( -1, "The dual-output miter should have an even number of outputs.\n" );
                return 1;
            }
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a double-output miter. (Conflict limit = %d.)\n", pPars->nBTLimit );
            Gia_ManDemiterDual( pAbc->pGia, &pGia0, &pGia1 );
            pAbc->Status = Gia_PolynCec( pGia0, pGia1, pPars );
        }
        else if ( fTwoOutput )
        {
            if ( Gia_ManPoNum(pAbc->pGia) & 1 )
            {
                Abc_Print( -1, "The dual-output miter should have an even number of outputs.\n" );
                return 1;
            }
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a two-word miter. (Conflict limit = %d.)\n", pPars->nBTLimit );
            Gia_ManDemiterTwoWords( pAbc->pGia, &pGia0, &pGia1 );
            pAbc->Status = Gia_PolynCec( pGia0, pGia1, pPars );
        }
        else
        {
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a single-output miter. (Conflict limit = %d.)\n", pPars->nBTLimit );
            pDual = Gia_ManDemiterToDual( pAbc->pGia );
            Gia_ManDemiterDual( pDual, &pGia0, &pGia1 );
            Gia_ManStop( pDual );
            pAbc->Status = Gia_PolynCec( pGia0, pGia1, pPars );
        }        
        Abc_FrameReplaceCex( pAbc, &pGia0->pCexComb );
        Gia_ManStop( pGia0 );
        Gia_ManStop( pGia1 );
        return 0;
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        if ( pAbc->pGia->pSpec == NULL )
        {
            Abc_Print( -1, "File name is not given on the command line.\n" );
            return 1;
        }
        FileName = pAbc->pGia->pSpec;
    }
    else
        FileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pTemp = FileName; *pTemp; pTemp++ )
        if ( *pTemp == '>' )
            *pTemp = '\\';
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", FileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );
    pSecond = Gia_AigerRead( FileName, 0, 0, 0 );
    if ( pSecond == NULL )
    {
        Abc_Print( -1, "Reading AIGER has failed.\n" );
        return 0;
    }
    pAbc->Status = Gia_PolynCec( pAbc->pGia, pSecond, pPars );
    Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexComb );
    Gia_ManStop( pSecond );
    return 0;

usage:
    Abc_Print( -2, "usage: &acec [-CT num] [-nmdtvh]\n" );
    Abc_Print( -2, "\t         combinational equivalence checking for arithmetic circuits\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-n     : toggle using naive SAT-based checking [default = %s]\n", pPars->fNaive? "yes":"no");
    Abc_Print( -2, "\t-m     : toggle miter vs. two circuits [default = %s]\n", fMiter? "miter":"two circuits");
    Abc_Print( -2, "\t-d     : toggle using dual output miter [default = %s]\n", fDualOutput? "yes":"no");
    Abc_Print( -2, "\t-t     : toggle using two-word miter [default = %s]\n", fTwoOutput? "yes":"no");
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", pPars->fVerbose? "yes":"no");
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}